

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuf.c
# Opt level: O1

void ecs_strbuf_grow_str(ecs_strbuf_t *b,char *str,char *alloc_str,int32_t size)

{
  ecs_strbuf_element *peVar1;
  size_t sVar2;
  
  peVar1 = (ecs_strbuf_element *)(*ecs_os_api.malloc_)(0x20);
  b->size = b->size + b->current->pos;
  b->current->next = peVar1;
  b->current = peVar1;
  b->elementCount = b->elementCount + 1;
  peVar1->buffer_embedded = false;
  if (size == 0) {
    sVar2 = strlen(str);
    size = (int32_t)sVar2;
  }
  peVar1->pos = size;
  peVar1->next = (ecs_strbuf_element *)0x0;
  peVar1->buf = str;
  *(char **)(peVar1 + 1) = alloc_str;
  return;
}

Assistant:

static
void ecs_strbuf_grow_str(
    ecs_strbuf_t *b,
    char *str,
    char *alloc_str,
    int32_t size)
{
    /* Allocate new element */
    ecs_strbuf_element_str *e = ecs_os_malloc(sizeof(ecs_strbuf_element_str));
    b->size += b->current->pos;
    b->current->next = (ecs_strbuf_element*)e;
    b->current = (ecs_strbuf_element*)e;
    b->elementCount ++;
    e->super.buffer_embedded = false;
    e->super.pos = size ? size : (int32_t)ecs_os_strlen(str);
    e->super.next = NULL;
    e->super.buf = str;
    e->alloc_str = alloc_str;
}